

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keywords.cpp
# Opt level: O0

SyntaxKind psy::C::recognize7(char *s,ParseOptions *opts)

{
  Std SVar1;
  bool bVar2;
  LanguageDialect *pLVar3;
  LanguageExtensions *pLVar4;
  MacroTranslations *pMVar5;
  ParseOptions *opts_local;
  char *s_local;
  
  if (*s == '_') {
    if (s[1] == '_') {
      if (s[2] == 'a') {
        if ((((s[3] == 's') && (s[4] == 'm')) && (s[5] == '_')) && (s[6] == '_')) {
          return KeywordAlias___asm;
        }
      }
      else if (((s[2] == 'c') && (s[3] == 'o')) &&
              ((s[4] == 'n' && ((s[5] == 's' && (s[6] == 't')))))) {
        return KeywordAlias___const;
      }
    }
    else {
      if (s[1] == 'A') {
        pLVar3 = ParseOptions::languageDialect(opts);
        SVar1 = LanguageDialect::std(pLVar3);
        bVar2 = operator>=(SVar1,C11);
        if (bVar2) {
          if (s[2] != 't') {
            return IdentifierToken;
          }
          if (s[3] != 'o') {
            return IdentifierToken;
          }
          if (s[4] != 'm') {
            return IdentifierToken;
          }
          if (s[5] != 'i') {
            return IdentifierToken;
          }
          if (s[6] != 'c') {
            return IdentifierToken;
          }
          return Keyword__Atomic;
        }
      }
      if (s[1] == 'F') {
        pLVar4 = ParseOptions::languageExtensions(opts);
        bVar2 = LanguageExtensions::isEnabled_extPSY_Generics(pLVar4);
        if (bVar2) {
          if (s[2] != 'o') {
            return IdentifierToken;
          }
          if (s[3] != 'r') {
            return IdentifierToken;
          }
          if (s[4] != 'a') {
            return IdentifierToken;
          }
          if (s[5] != 'l') {
            return IdentifierToken;
          }
          if (s[6] != 'l') {
            return IdentifierToken;
          }
          return Keyword_ExtPSY__Forall;
        }
      }
      if (s[1] == 'E') {
        pLVar4 = ParseOptions::languageExtensions(opts);
        bVar2 = LanguageExtensions::isEnabled_extPSY_Generics(pLVar4);
        if (((((bVar2) && (s[2] == 'x')) && (s[3] == 'i')) && ((s[4] == 's' && (s[5] == 't')))) &&
           (s[6] == 's')) {
          return Keyword_ExtPSY__Exists;
        }
      }
    }
  }
  else {
    if (*s == 'a') {
      pLVar3 = ParseOptions::languageDialect(opts);
      SVar1 = LanguageDialect::std(pLVar3);
      bVar2 = operator>=(SVar1,C11);
      if (bVar2) {
        if (s[1] != 'l') {
          return IdentifierToken;
        }
        if (s[2] != 'i') {
          return IdentifierToken;
        }
        if (s[3] != 'g') {
          return IdentifierToken;
        }
        if (s[4] != 'n') {
          return IdentifierToken;
        }
        if (s[5] != 'a') {
          if (s[5] != 'o') {
            return IdentifierToken;
          }
          if (s[6] != 'f') {
            return IdentifierToken;
          }
          pLVar4 = ParseOptions::languageExtensions(opts);
          pMVar5 = LanguageExtensions::translations(pLVar4);
          bVar2 = MacroTranslations::isEnabled_Translate_alignof_AsKeyword(pMVar5);
          if (!bVar2) {
            return IdentifierToken;
          }
          return KeywordAlias___alignof;
        }
        if (s[6] != 's') {
          return IdentifierToken;
        }
        pLVar4 = ParseOptions::languageExtensions(opts);
        pMVar5 = LanguageExtensions::translations(pLVar4);
        bVar2 = MacroTranslations::isEnabled_Translate_alignas_AsKeyword(pMVar5);
        if (!bVar2) {
          return IdentifierToken;
        }
        return KeywordAlias___alignas;
      }
    }
    if (*s == 'd') {
      if ((((s[1] == 'e') && (s[2] == 'f')) && ((s[3] == 'a' && ((s[4] == 'u' && (s[5] == 'l'))))))
         && (s[6] == 't')) {
        return Keyword_default;
      }
    }
    else {
      if (*s == 'n') {
        pLVar4 = ParseOptions::languageExtensions(opts);
        bVar2 = LanguageExtensions::isEnabled_CPP_nullptr(pLVar4);
        if (bVar2) {
          if (s[1] != 'u') {
            return IdentifierToken;
          }
          if (s[2] != 'l') {
            return IdentifierToken;
          }
          if (s[3] != 'l') {
            return IdentifierToken;
          }
          if (s[4] != 'p') {
            return IdentifierToken;
          }
          if (s[5] != 't') {
            return IdentifierToken;
          }
          if (s[6] != 'r') {
            return IdentifierToken;
          }
          return Keyword_Ext_nullptr;
        }
      }
      if (*s == 't') {
        if (((s[1] == 'y') && (s[2] == 'p')) &&
           ((s[3] == 'e' && (((s[4] == 'd' && (s[5] == 'e')) && (s[6] == 'f')))))) {
          return Keyword_typedef;
        }
      }
      else if (*s == 'w') {
        pLVar4 = ParseOptions::languageExtensions(opts);
        bVar2 = LanguageExtensions::isEnabled_extC_wchar_t_Keyword(pLVar4);
        if ((((bVar2) && (s[1] == 'c')) && (s[2] == 'h')) &&
           (((s[3] == 'a' && (s[4] == 'r')) && ((s[5] == '_' && (s[6] == 't')))))) {
          return Keyword_Ext_wchar_t;
        }
      }
    }
  }
  return IdentifierToken;
}

Assistant:

static inline SyntaxKind recognize7(const char* s, const ParseOptions& opts)
{
    if (s[0] == '_') {
        if (s[1] == '_') {
            if (s[2] == 'a') {
                if (s[3] == 's') {
                    if (s[4] == 'm') {
                        if (s[5] == '_') {
                            if (s[6] == '_') {
                                return SyntaxKind::Keyword_ExtGNU___asm__;
                            }
                        }
                    }
                }
            }
            else if (s[2] == 'c') {
                if (s[3] == 'o') {
                    if (s[4] == 'n') {
                        if (s[5] == 's') {
                            if (s[6] == 't') {
                                return SyntaxKind::KeywordAlias___const;
                            }
                        }
                    }
                }
            }
        }
        else if (s[1] == 'A'
                 && opts.languageDialect().std() >= LanguageDialect::Std::C11) {
            if (s[2] == 't') {
                if (s[3] == 'o') {
                    if (s[4] == 'm') {
                        if (s[5] == 'i') {
                            if (s[6] == 'c') {
                                return SyntaxKind::Keyword__Atomic;
                            }
                        }
                    }
                }
            }
        }
        else if (s[1] == 'F'
                 && opts.languageExtensions().isEnabled_extPSY_Generics()) {
            if (s[2] == 'o') {
                if (s[3] == 'r') {
                    if (s[4] == 'a') {
                        if (s[5] == 'l') {
                            if (s[6] == 'l') {
                                return SyntaxKind::Keyword_ExtPSY__Forall;
                            }
                        }
                    }
                }
            }
        }
        else if (s[1] == 'E'
                 && opts.languageExtensions().isEnabled_extPSY_Generics()) {
            if (s[2] == 'x') {
                if (s[3] == 'i') {
                    if (s[4] == 's') {
                        if (s[5] == 't') {
                            if (s[6] == 's') {
                                return SyntaxKind::Keyword_ExtPSY__Exists;
                            }
                        }
                    }
                }
            }
        }
    }
    else if (s[0] == 'a'
                && opts.languageDialect().std() >= LanguageDialect::Std::C11) {
        if (s[1] == 'l') {
            if (s[2] == 'i') {
                if (s[3] == 'g') {
                    if (s[4] == 'n') {
                        if (s[5] == 'a') {
                            if (s[6] == 's'
                                    && opts.languageExtensions().translations().isEnabled_Translate_alignas_AsKeyword()) {
                                return SyntaxKind::Keyword__Alignas;
                            }
                        }
                        else if (s[5] == 'o') {
                            if (s[6] == 'f'
                                    && opts.languageExtensions().translations().isEnabled_Translate_alignof_AsKeyword()) {
                                return SyntaxKind::Keyword__Alignof;
                            }
                        }
                    }
                }
            }
        }
    }
    else if (s[0] == 'd') {
        if (s[1] == 'e') {
            if (s[2] == 'f') {
                if (s[3] == 'a') {
                    if (s[4] == 'u') {
                        if (s[5] == 'l') {
                            if (s[6] == 't') {
                                return SyntaxKind::Keyword_default;
                            }
                        }
                    }
                }
            }
        }
    }
    else if (s[0] == 'n'
             && opts.languageExtensions().isEnabled_CPP_nullptr()) {
        if (s[1] == 'u') {
            if (s[2] == 'l') {
                if (s[3] == 'l') {
                    if (s[4] == 'p') {
                        if (s[5] == 't') {
                            if (s[6] == 'r') {
                                return SyntaxKind::Keyword_Ext_nullptr;
                            }
                        }
                    }
                }
            }
        }
    }
    else if (s[0] == 't') {
        if (s[1] == 'y') {
            if (s[2] == 'p') {
                if (s[3] == 'e') {
                    if (s[4] == 'd') {
                        if (s[5] == 'e') {
                            if (s[6] == 'f') {
                                return SyntaxKind::Keyword_typedef;
                            }
                        }
                    }
                }
            }
        }
    }
    else if (s[0] == 'w'
               && opts.languageExtensions().isEnabled_extC_wchar_t_Keyword()) {
        if (s[1] == 'c') {
            if (s[2] == 'h') {
                if (s[3] == 'a') {
                    if (s[4] == 'r') {
                        if (s[5] == '_') {
                            if (s[6] == 't') {
                                return SyntaxKind::Keyword_Ext_wchar_t;
                            }
                        }
                    }
                }
            }
        }
    }
    return SyntaxKind::IdentifierToken;
}